

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O2

void __thiscall
QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder
          (QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *this)

{
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->b).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this);
  return;
}

Assistant:

~QStringBuilder() = default;